

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gd_stderr_error(int priority,char *format,__va_list_tag *args)

{
  if (priority - 3U < 5) {
    fputs(&DAT_001220d8 + *(int *)(&DAT_001220d8 + (ulong)(priority - 3U) * 4),_stderr);
  }
  vfprintf(_stderr,format,args);
  fflush(_stderr);
  return;
}

Assistant:

void gd_stderr_error(int priority, const char *format, va_list args)
{
	switch (priority) {
	case GD_ERROR:
		fputs("GD Error: ", stderr);
		break;
	case GD_WARNING:
		fputs("GD Warning: ", stderr);
		break;
	case GD_NOTICE:
		fputs("GD Notice: ", stderr);
		break;
	case GD_INFO:
		fputs("GD Info: ", stderr);
		break;
	case GD_DEBUG:
		fputs("GD Debug: ", stderr);
		break;
	}
	vfprintf(stderr, format, args);
	fflush(stderr);
}